

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICrash.cpp
# Opt level: O0

void updateParameters(Quadratic *idata,ICrashOptions *options,int iteration)

{
  double dVar1;
  vector<double,_std::allocator<double>_> *residual_00;
  reference pvVar2;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double dVar3;
  int row_1;
  vector<double,_std::allocator<double>_> residual;
  int row;
  vector<double,_std::allocator<double>_> residual_ica;
  HighsSolution *in_stack_ffffffffffffff38;
  HighsLp *in_stack_ffffffffffffff40;
  value_type vVar4;
  allocator_type *in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  HighsSolution *in_stack_ffffffffffffff58;
  HighsSolution *sol;
  HighsLp *in_stack_ffffffffffffff60;
  int local_78;
  HighsSolution local_71;
  long local_8;
  
  if (in_EDX != 1) {
    local_8 = in_RDI;
    switch(*(undefined4 *)(in_RSI + 4)) {
    case 0:
      *(double *)(in_RDI + 0x4c8) = *(double *)(in_RDI + 0x4c8) * 0.1;
      break;
    case 1:
      highsLogUser((HighsLogOptions *)(in_RSI + 0x20),kInfo,
                   "ICrashError: ADMM parameter update not implemented yet.");
      break;
    case 2:
      if (in_EDX % 3 == 0) {
        *(double *)(in_RDI + 0x4c8) = *(double *)(in_RDI + 0x4c8) * 0.1;
      }
      else {
        local_71.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._1_8_ = 0;
        std::allocator<double>::allocator((allocator<double> *)0x745bad);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                   (size_type)in_stack_ffffffffffffff58,
                   (value_type_conflict1 *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        std::allocator<double>::~allocator((allocator<double> *)0x745bdb);
        updateResidualIca(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff50);
        for (local_71.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start._1_4_ = 0;
            local_71.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start._1_4_ < *(int *)(local_8 + 4);
            local_71.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start._1_4_ =
                 local_71.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start._1_4_ + 1) {
          dVar3 = *(double *)(local_8 + 0x4c8);
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              ((long)&local_71.row_value.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish + 1),
                              (long)local_71.col_dual.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start._1_4_);
          dVar1 = *pvVar2;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_8 + 0x4d0),
                              (long)local_71.col_dual.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start._1_4_);
          *pvVar2 = dVar3 * dVar1;
        }
        std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff50);
      }
      break;
    case 3:
      if (in_EDX % 3 == 0) {
        *(double *)(in_RDI + 0x4c8) = *(double *)(in_RDI + 0x4c8) * 0.1;
      }
      break;
    case 4:
      if (in_EDX % 3 == 0) {
        *(double *)(in_RDI + 0x4c8) = *(double *)(in_RDI + 0x4c8) * 0.1;
      }
      else {
        calculateRowValuesQuad(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0);
        residual_00 = (vector<double,_std::allocator<double>_> *)(long)*(int *)(local_8 + 4);
        local_71._1_8_ = 0;
        sol = &local_71;
        std::allocator<double>::allocator((allocator<double> *)0x745da0);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
                   (size_type)sol,(value_type_conflict1 *)residual_00,in_stack_ffffffffffffff48);
        std::allocator<double>::~allocator((allocator<double> *)0x745dc5);
        updateResidualFast(in_stack_ffffffffffffff60,sol,residual_00);
        for (local_78 = 0; local_78 < *(int *)(local_8 + 4); local_78 = local_78 + 1) {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_8 + 0x4d0),
                              (long)local_78);
          vVar4 = *pvVar2;
          dVar3 = *(double *)(local_8 + 0x4c8);
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              ((long)&local_71.col_value.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start + 1),(long)local_78);
          dVar3 = dVar3 * *pvVar2 + vVar4;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_8 + 0x4d0),
                              (long)local_78);
          *pvVar2 = dVar3;
        }
        std::vector<double,_std::allocator<double>_>::~vector(residual_00);
      }
    }
  }
  return;
}

Assistant:

void updateParameters(Quadratic& idata, const ICrashOptions& options,
                      const int iteration) {
  if (iteration == 1) return;

  // The other strategies are WIP.
  switch (options.strategy) {
    case ICrashStrategy::kPenalty: {
      idata.mu = 0.1 * idata.mu;
      break;
    }
    case ICrashStrategy::kAdmm: {
      // std::cout << "ICrash Error: ADMM parameter update not implemented." <<
      // std::endl;
      highsLogUser(options.log_options, HighsLogType::kInfo,
                   "ICrashError: ADMM parameter update not implemented yet.");
      break;
    }
    case ICrashStrategy::kICA: {
      // Update mu every third iteration, otherwise update lambda.
      if (iteration % 3 == 0) {
        idata.mu = 0.1 * idata.mu;
      } else {
        std::vector<double> residual_ica(idata.lp.num_row_, 0);
        updateResidualIca(idata.lp, idata.xk, residual_ica);
        for (int row = 0; row < idata.lp.num_row_; row++)
          idata.lambda[row] = idata.mu * residual_ica[row];
      }
      break;
    }
    case ICrashStrategy::kUpdatePenalty: {
      // Update mu every third iteration, otherwise do nothing.
      if (iteration % 3 == 0) idata.mu = 0.1 * idata.mu;
      break;
    }
    case ICrashStrategy::kUpdateAdmm: {
      // Update mu every third iteration, otherwise update lambda.
      if (iteration % 3 == 0) {
        idata.mu = 0.1 * idata.mu;
      } else {
        calculateRowValuesQuad(idata.lp, idata.xk);
        std::vector<double> residual(idata.lp.num_row_, 0);
        updateResidualFast(idata.lp, idata.xk, residual);
        for (int row = 0; row < idata.lp.num_row_; row++)
          // todo: double check clp.
          idata.lambda[row] = idata.lambda[row] + idata.mu * residual[row];
      }
      break;
    }
  }
}